

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void update_polygon_display(void)

{
  if (currentMode == 0) {
    (*glad_glPolygonMode)(0x408,0x1b01);
  }
  else if (currentMode == 1) {
    (*glad_glPolygonMode)(0x408,0x1b00);
  }
  else if (currentMode - 2U < 2) {
    (*glad_glPolygonMode)(0x408,0x1b02);
  }
  return;
}

Assistant:

void update_polygon_display() {
    switch (currentMode) {
        case 0:
            glPolygonMode(GL_FRONT_AND_BACK, GL_LINE);
            break;
        case 1:
            glPolygonMode(GL_FRONT_AND_BACK, GL_POINT);
            break;
        case 2:
        case 3:
            glPolygonMode(GL_FRONT_AND_BACK, GL_FILL);
            break;
        default:;
    }
}